

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::newBoard(Board *this,Vector2u *size,string *filename,bool startEmpty)

{
  uint uVar1;
  runtime_error *this_00;
  long lVar2;
  ulong uVar3;
  Board *pBVar4;
  void *pvVar5;
  Vector2u *position;
  byte in_CL;
  string *in_RDX;
  uint *in_RSI;
  Tile *in_RDI;
  Board *unaff_retaddr;
  uint x;
  uint y;
  size_t dotPosition;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  VertexArray *in_stack_ffffffffffffff80;
  Board *in_stack_ffffffffffffff88;
  Vector2<unsigned_int> local_68;
  uint local_60;
  uint local_5c;
  string local_58 [8];
  Board *in_stack_ffffffffffffffb0;
  
  if ((*in_RSI != 0) && (in_RSI[1] != 0)) {
    lVar2 = std::__cxx11::string::rfind((char)in_RDX,0x2e);
    if (lVar2 == -1) {
      std::__cxx11::string::operator=((string *)&in_RDI[4]._position,in_RDX);
    }
    else {
      std::__cxx11::string::substr((ulong)local_58,(ulong)in_RDX);
      std::__cxx11::string::operator=((string *)&in_RDI[4]._position,local_58);
      std::__cxx11::string::~string(local_58);
    }
    clear(unaff_retaddr);
    sf::VertexArray::resize
              (in_stack_ffffffffffffff80,
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
    uVar1 = in_RSI[1];
    in_RDI[0x13]._direction = in_RSI[0];
    *(uint *)&in_RDI[0x13].field_0xc = uVar1;
    _setVertexCoords(in_stack_ffffffffffffffb0);
    uVar3 = SUB168(ZEXT416(in_RSI[1]) * ZEXT816(8),0);
    if (SUB168(ZEXT416(in_RSI[1]) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pBVar4 = (Board *)operator_new__(uVar3);
    in_RDI[0x13]._boardPtr = pBVar4;
    for (local_5c = 0; local_5c < in_RSI[1]; local_5c = local_5c + 1) {
      uVar3 = SUB168(ZEXT416(*in_RSI) * ZEXT816(8),0);
      if (SUB168(ZEXT416(*in_RSI) * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pvVar5 = operator_new__(uVar3);
      *(void **)(((in_RDI[0x13]._boardPtr)->super_Transformable).m_transform.m_matrix +
                (ulong)local_5c * 2 + -0xb) = pvVar5;
      if ((in_CL & 1) == 0) {
        for (local_60 = 0; local_60 < *in_RSI; local_60 = local_60 + 1) {
          position = (Vector2u *)operator_new(0x28);
          sf::Vector2<unsigned_int>::Vector2(&local_68,local_60,local_5c);
          Tile::Tile(in_RDI,in_stack_ffffffffffffff88,position,(bool)in_stack_ffffffffffffff7f,
                     (bool)in_stack_ffffffffffffff7e);
          *(Vector2u **)
           (*(long *)(((in_RDI[0x13]._boardPtr)->super_Transformable).m_transform.m_matrix +
                     (ulong)local_5c * 2 + -0xb) + (ulong)local_60 * 8) = position;
        }
      }
    }
    *(undefined1 *)&in_RDI[5]._boardPtr = 0;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Board dimensions cannot be zero or negative.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Board::newBoard(const Vector2u& size, const string& filename, bool startEmpty) {
    if (size.x == 0 || size.y == 0) {
        throw runtime_error("Board dimensions cannot be zero or negative.");
    }
    size_t dotPosition = filename.rfind('.');
    if (dotPosition != string::npos) {
        name = filename.substr(0, dotPosition);
    } else {
        name = filename;
    }
    clear();
    
    _vertices.resize(size.x * size.y * 4);
    _size = size;
    _setVertexCoords();
    _tileArray = new Tile**[size.y];
    for (unsigned int y = 0; y < size.y; ++y) {    // Create new board and add blank tiles if startEmpty is false.
        _tileArray[y] = new Tile*[size.x];
        if (!startEmpty) {
            for (unsigned int x = 0; x < size.x; ++x) {
                _tileArray[y][x] = new Tile(this, Vector2u(x, y), true);
            }
        }
    }
    changesMade = false;
}